

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O3

vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
* __thiscall
gl3cts::ReservedNamesTest::getSupportedShaderTypes
          (vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
           *__return_storage_ptr__,ReservedNamesTest *this)

{
  bool bVar1;
  ContextType ctxType;
  ulong in_RAX;
  anon_enum_32 *paVar2;
  iterator iVar3;
  pointer *ppaVar4;
  pointer *ppaVar5;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  (__return_storage_ptr__->
  super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x134);
  if (bVar1) {
    uStack_28 = uStack_28 & 0xffffffff;
    std::
    vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
    ::_M_realloc_insert<gl3cts::ReservedNamesTest::_shader_type>
              (__return_storage_ptr__,(iterator)0x0,(anon_enum_32 *)((long)&uStack_28 + 4));
    iVar3._M_current =
         (__return_storage_ptr__->
         super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    uStack_28 = CONCAT44(1,(undefined4)uStack_28);
    if (iVar3._M_current !=
        (__return_storage_ptr__->
        super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      *iVar3._M_current = LANGUAGE_FEATURE_ATTRIBUTE;
      (__return_storage_ptr__->
      super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
      )._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      goto LAB_00a84041;
    }
  }
  else {
    uStack_28 = CONCAT44(1,(undefined4)uStack_28);
    iVar3._M_current = (anon_enum_32 *)0x0;
  }
  std::
  vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  ::_M_realloc_insert<gl3cts::ReservedNamesTest::_shader_type>
            (__return_storage_ptr__,iVar3,(anon_enum_32 *)((long)&uStack_28 + 4));
LAB_00a84041:
  ppaVar5 = &(__return_storage_ptr__->
             super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppaVar4 = &(__return_storage_ptr__->
             super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x123);
  if (bVar1) {
    uStack_28 = CONCAT44(2,(undefined4)uStack_28);
    iVar3._M_current = *ppaVar4;
    if (iVar3._M_current == *ppaVar5) {
      std::
      vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
      ::_M_realloc_insert<gl3cts::ReservedNamesTest::_shader_type>
                (__return_storage_ptr__,iVar3,(anon_enum_32 *)((long)&uStack_28 + 4));
    }
    else {
      *iVar3._M_current = LANGUAGE_FEATURE_CONSTANT;
      *ppaVar4 = iVar3._M_current + 1;
    }
  }
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x104);
  iVar3._M_current = *ppaVar4;
  paVar2 = *ppaVar5;
  if (bVar1) {
    uStack_28 = CONCAT44(3,(undefined4)uStack_28);
    if (iVar3._M_current == paVar2) {
      std::
      vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
      ::_M_realloc_insert<gl3cts::ReservedNamesTest::_shader_type>
                (__return_storage_ptr__,iVar3,(anon_enum_32 *)((long)&uStack_28 + 4));
      iVar3._M_current = *ppaVar4;
      paVar2 = *ppaVar5;
    }
    else {
      *iVar3._M_current = LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME;
      iVar3._M_current = iVar3._M_current + 1;
      *ppaVar4 = iVar3._M_current;
    }
    uStack_28 = CONCAT44(4,(undefined4)uStack_28);
    if (iVar3._M_current == paVar2) {
      std::
      vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
      ::_M_realloc_insert<gl3cts::ReservedNamesTest::_shader_type>
                (__return_storage_ptr__,iVar3,(anon_enum_32 *)((long)&uStack_28 + 4));
      iVar3._M_current = *ppaVar4;
      paVar2 = *ppaVar5;
    }
    else {
      *iVar3._M_current = LANGUAGE_FEATURE_FUNCTION_NAME;
      iVar3._M_current = iVar3._M_current + 1;
      *ppaVar4 = iVar3._M_current;
    }
  }
  uStack_28 = CONCAT44(5,(undefined4)uStack_28);
  if (iVar3._M_current == paVar2) {
    std::
    vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
    ::_M_realloc_insert<gl3cts::ReservedNamesTest::_shader_type>
              (__return_storage_ptr__,iVar3,(anon_enum_32 *)((long)&uStack_28 + 4));
  }
  else {
    *iVar3._M_current = LANGUAGE_FEATURE_INPUT;
    *ppaVar4 = iVar3._M_current + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ReservedNamesTest::_shader_type> ReservedNamesTest::getSupportedShaderTypes() const
{
	const glu::ContextType	context_type = m_context.getRenderContext().getType();
	std::vector<_shader_type> result;

	/* CS: Available, starting with GL 4.3 */
	if (glu::contextSupports(context_type, glu::ApiType::core(4, 3)))
	{
		result.push_back(SHADER_TYPE_COMPUTE);
	}

	/* FS: Always supported */
	result.push_back(SHADER_TYPE_FRAGMENT);

	/* GS: Available, starting with GL 3.2 */
	if (glu::contextSupports(context_type, glu::ApiType::core(3, 2)))
	{
		result.push_back(SHADER_TYPE_GEOMETRY);
	}

	/* TC: Available, starting with GL 4.0 */
	/* TE: Available, starting with GL 4.0 */
	if (glu::contextSupports(context_type, glu::ApiType::core(4, 0)))
	{
		result.push_back(SHADER_TYPE_TESS_CONTROL);
		result.push_back(SHADER_TYPE_TESS_EVALUATION);
	}

	/* VS: Always supported */
	result.push_back(SHADER_TYPE_VERTEX);

	return result;
}